

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5IntegrityMethod(sqlite3_vtab *pVtab,char *zSchema,char *zTabname,int isQuick,char **pzErr)

{
  long lVar1;
  sqlite3_blob *pBlob;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)pzErr;
  uVar2 = sqlite3Fts5StorageIntegrity((Fts5Storage *)pVtab[1].zErrMsg,0);
  if (uVar2 != 0 && *pzErr == (char *)0x0) {
    uVar3 = uVar2 & 0xff;
    if (uVar3 == 0xb) {
      pcVar5 = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",zSchema,zTabname);
      *pzErr = pcVar5;
      uVar2 = 7;
      if (pcVar5 != (char *)0x0) {
        uVar2 = 0;
      }
    }
    else {
      if (uVar2 == 0x204) {
        pcVar5 = "abort due to ROLLBACK";
      }
      else if (uVar2 == 0x65) {
        pcVar5 = "no more rows available";
      }
      else if (uVar2 == 100) {
        pcVar5 = "another row available";
      }
      else {
        pcVar5 = "unknown error";
        if ((uVar3 < 0x1d) && ((0x1410004UL >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          pcVar5 = *(char **)(sqlite3ErrStr_aMsg + (ulong)uVar3 * 8);
        }
      }
      pcVar5 = sqlite3_mprintf("unable to validate the inverted index for FTS5 table %s.%s: %s",
                               zSchema,zTabname,pcVar5);
      *pzErr = pcVar5;
    }
  }
  lVar1 = *(long *)&pVtab[1].nRef;
  pBlob = *(sqlite3_blob **)(lVar1 + 0x48);
  if (pBlob != (sqlite3_blob *)0x0) {
    *(undefined8 *)(lVar1 + 0x48) = 0;
    iVar4 = sqlite3_blob_close(pBlob);
    if (*(int *)(lVar1 + 0x3c) == 0) {
      *(int *)(lVar1 + 0x3c) = iVar4;
    }
  }
  *(undefined4 *)(lVar1 + 0x3c) = 0;
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)0x0;
  return uVar2;
}

Assistant:

static int fts5IntegrityMethod(
  sqlite3_vtab *pVtab,    /* the FTS5 virtual table to check */
  const char *zSchema,    /* Name of schema in which this table lives */
  const char *zTabname,   /* Name of the table itself */
  int isQuick,            /* True if this is a quick-check */
  char **pzErr            /* Write error message here */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  int rc;

  assert( pzErr!=0 && *pzErr==0 );
  UNUSED_PARAM(isQuick);
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = pzErr;
  rc = sqlite3Fts5StorageIntegrity(pTab->pStorage, 0);
  if( *pzErr==0 && rc!=SQLITE_OK ){
    if( (rc&0xff)==SQLITE_CORRUPT ){
      *pzErr = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",
          zSchema, zTabname);
      rc = (*pzErr) ? SQLITE_OK : SQLITE_NOMEM;
    }else{
      *pzErr = sqlite3_mprintf("unable to validate the inverted index for"
          " FTS5 table %s.%s: %s",
          zSchema, zTabname, sqlite3_errstr(rc));
    }
  }

  sqlite3Fts5IndexCloseReader(pTab->p.pIndex);
  pTab->p.pConfig->pzErrmsg = 0;

  return rc;
}